

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O1

void __thiscall Assimp::XFileParser::ParseDataObjectMeshNormals(XFileParser *this,Mesh *pMesh)

{
  pointer paVar1;
  pointer pFVar2;
  uint uVar3;
  uint uVar4;
  vector<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_> *this_00;
  long lVar5;
  ulong __new_size;
  uint a;
  ulong uVar6;
  aiVector3D aVar7;
  string local_58;
  
  readHeadOfDataObject(this,(string *)0x0);
  uVar3 = ReadInt(this);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
            (&pMesh->mNormals,(ulong)uVar3);
  if (uVar3 != 0) {
    lVar5 = 0;
    do {
      aVar7 = ReadVector3(this);
      paVar1 = (pMesh->mNormals).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      *(long *)((long)&paVar1->x + lVar5) = aVar7._0_8_;
      *(float *)((long)&paVar1->z + lVar5) = aVar7.z;
      lVar5 = lVar5 + 0xc;
    } while ((ulong)uVar3 * 0xc != lVar5);
  }
  uVar3 = ReadInt(this);
  __new_size = (ulong)uVar3;
  if (((long)(pMesh->mPosFaces).
             super__Vector_base<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(pMesh->mPosFaces).
             super__Vector_base<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>._M_impl.
             super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - __new_size == 0) {
    if (__new_size != 0) {
      this_00 = &pMesh->mNormFaces;
      std::vector<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>::resize
                (this_00,__new_size);
      uVar6 = 0;
      do {
        uVar3 = ReadInt(this);
        local_58._M_dataplus._M_p = (pointer)0x0;
        local_58._M_string_length = 0;
        local_58.field_2._M_allocated_capacity = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                  (&(this_00->
                    super__Vector_base<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar6].mIndices,&local_58);
        if (local_58._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_58._M_dataplus._M_p,
                          local_58.field_2._M_allocated_capacity - (long)local_58._M_dataplus._M_p);
        }
        if (uVar3 != 0) {
          pFVar2 = (this_00->
                   super__Vector_base<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          do {
            uVar4 = ReadInt(this);
            local_58._M_dataplus._M_p._0_4_ = uVar4;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      (&pFVar2[uVar6].mIndices,(uint *)&local_58);
            uVar3 = uVar3 - 1;
          } while (uVar3 != 0);
        }
        TestForSeparator(this);
        uVar6 = uVar6 + 1;
      } while (uVar6 != __new_size);
    }
    CheckForClosingBrace(this);
    return;
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"Normal face count does not match vertex face count.","");
  ThrowException(this,&local_58);
}

Assistant:

void XFileParser::ParseDataObjectMeshNormals( Mesh* pMesh)
{
    readHeadOfDataObject();

    // read count
    unsigned int numNormals = ReadInt();
    pMesh->mNormals.resize( numNormals);

    // read normal vectors
    for( unsigned int a = 0; a < numNormals; ++a) {
        pMesh->mNormals[a] = ReadVector3();
    }

    // read normal indices
    unsigned int numFaces = ReadInt();
    if( numFaces != pMesh->mPosFaces.size()) {
        ThrowException( "Normal face count does not match vertex face count.");
    }

    // do not crah when no face definitions are there
    if (numFaces > 0) {
        // normal face creation
        pMesh->mNormFaces.resize( numFaces );
        for( unsigned int a = 0; a < numFaces; ++a ) {
            unsigned int numIndices = ReadInt();
            pMesh->mNormFaces[a] = Face();
            Face& face = pMesh->mNormFaces[a];
            for( unsigned int b = 0; b < numIndices; ++b ) {
                face.mIndices.push_back( ReadInt());
            }

            TestForSeparator();
        }
    }

    CheckForClosingBrace();
}